

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_5450::TlbExportVisitor::visit_(TlbExportVisitor *this,Numeric *type)

{
  char *__s;
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  string local_60;
  string local_40;
  
  poVar2 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<numeric name=\"",0xf);
  Typelib::Type::getName_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"category=\"",10);
  iVar1 = Typelib::Numeric::getNumericCategory();
  if (iVar1 - 8U < 3) {
    __s = (&PTR_anon_var_dwarf_40fd_001136e0)[iVar1 - 8U];
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"size=\"",6);
    Typelib::Type::getSize();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
    (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_40,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,">\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                        (this->m_indent)._M_string_length);
    auVar5 = Typelib::Type::getMetaData();
    (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
              (&local_60,auVar5._0_8_,auVar5._8_8_);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                        (this->m_indent)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</numeric>",10);
    return true;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "invalid category";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

bool TlbExportVisitor::visit_(Numeric const& type)
    {
        m_stream
            << "<numeric name=\"" << type.getName() << "\" "
            << "category=\"" << getStringCategory(type.getNumericCategory()) << "\" "
            << "size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</numeric>";

        return true;
    }